

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O2

BVFixed * BVFixed::New<Memory::JitArenaAllocator>
                    (BVIndex length,JitArenaAllocator *alloc,bool initialSet)

{
  BVFixed *this;
  
  WordCount(length);
  WordCount(length);
  this = (BVFixed *)new<Memory::JitArenaAllocator>(8,alloc,0x3dbab4,0);
  BVFixed(this,length,initialSet);
  return this;
}

Assistant:

BVFixed * BVFixed::New(DECLSPEC_GUARD_OVERFLOW BVIndex length, TAllocator * alloc, bool initialSet)
{
    BVFixed *result = AllocatorNewPlusLeaf(TAllocator, alloc, sizeof(BVUnit) * BVFixed::WordCount(length), BVFixed, length, initialSet);
    return result;
}